

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void JX9CoreShutdown(void)

{
  jx9 *pjVar1;
  jx9 *pNext;
  jx9 *pEngine;
  
  pNext = sJx9MPGlobal.pEngines;
  for (; 0 < sJx9MPGlobal.nEngine; sJx9MPGlobal.nEngine = sJx9MPGlobal.nEngine + -1) {
    pjVar1 = pNext->pNext;
    EngineRelease(pNext);
    pNext = pjVar1;
  }
  if (sJx9MPGlobal.sAllocator.pMethods != (SyMemMethods *)0x0) {
    SyMemBackendRelease(&sJx9MPGlobal.sAllocator);
  }
  sJx9MPGlobal.nMagic = 0x1928;
  return;
}

Assistant:

static void JX9CoreShutdown(void)
{
	jx9 *pEngine, *pNext;
	/* Release all active engines first */
	pEngine = sJx9MPGlobal.pEngines;
	for(;;){
		if( sJx9MPGlobal.nEngine < 1 ){
			break;
		}
		pNext = pEngine->pNext;
		EngineRelease(pEngine); 
		pEngine = pNext;
		sJx9MPGlobal.nEngine--;
	}
#if defined(JX9_ENABLE_THREADS)
	/* Release the mutex subsystem */
	if( sJx9MPGlobal.pMutexMethods ){
		if( sJx9MPGlobal.pMutex ){
			SyMutexRelease(sJx9MPGlobal.pMutexMethods, sJx9MPGlobal.pMutex);
			sJx9MPGlobal.pMutex = 0;
		}
		if( sJx9MPGlobal.pMutexMethods->xGlobalRelease ){
			sJx9MPGlobal.pMutexMethods->xGlobalRelease();
		}
		sJx9MPGlobal.pMutexMethods = 0;
	}
	sJx9MPGlobal.nThreadingLevel = 0;
#endif
	if( sJx9MPGlobal.sAllocator.pMethods ){
		/* Release the memory backend */
		SyMemBackendRelease(&sJx9MPGlobal.sAllocator);
	}
	sJx9MPGlobal.nMagic = 0x1928;	
}